

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_info_annex_imgui.h
# Opt level: O2

void lumeview::SubsetInfoAnnex_ImGui(SubsetInfoAnnex *sia)

{
  Color *this;
  bool *v;
  bool bVar1;
  bool bVar2;
  reference ptr_id;
  uint uVar3;
  bool local_56;
  bool local_55;
  uint local_54;
  SubsetInfoAnnex *sia_local;
  Color oldColor;
  
  uVar3 = (uint)(((long)(sia->m_subsetProps).
                        super__Vector_base<lume::SubsetInfoAnnex::SubsetProperties,_std::allocator<lume::SubsetInfoAnnex::SubsetProperties>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(sia->m_subsetProps).
                       super__Vector_base<lume::SubsetInfoAnnex::SubsetProperties,_std::allocator<lume::SubsetInfoAnnex::SubsetProperties>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x38);
  sia_local = sia;
  if (uVar3 != 0) {
    ImGui::NewLine();
    ImGui::SameLine(60.0,-1.0);
    ImGui::Text("name");
    ImGui::SameLine(160.0,-1.0);
    ImGui::Text("color");
    ImGui::SameLine(210.0,-1.0);
    ImGui::Text("visible");
    ImGui::Separator();
  }
  for (local_54 = 0; local_54 < uVar3; local_54 = local_54 + 1) {
    ptr_id = std::
             vector<lume::SubsetInfoAnnex::SubsetProperties,_std::allocator<lume::SubsetInfoAnnex::SubsetProperties>_>
             ::at(&sia_local->m_subsetProps,(ulong)local_54);
    this = &ptr_id->color;
    oldColor.m_data._0_8_ = *(undefined8 *)(ptr_id->color).m_data;
    oldColor.m_data._8_8_ = *(undefined8 *)((ptr_id->color).m_data + 2);
    v = &ptr_id->visible;
    bVar1 = ptr_id->visible;
    ImGui::PushID(ptr_id);
    ImGui::AlignTextToFramePadding();
    ImGui::Text("%d:",(ulong)local_54);
    ImGui::SameLine(60.0,-1.0);
    ImGui::Text((ptr_id->name)._M_dataplus._M_p);
    ImGui::SameLine(160.0,-1.0);
    ImGui::ColorEdit4("",this->m_data,0x20);
    ImGui::SameLine(210.0,-1.0);
    ImGui::Checkbox("",v);
    if (local_54 + 1 != uVar3) {
      ImGui::Separator();
    }
    ImGui::PopID();
    bVar2 = lume::SubsetInfoAnnex::Color::operator!=(this,&oldColor);
    if ((bVar2) || (*v != bVar1)) {
      local_55 = lume::SubsetInfoAnnex::Color::operator!=(this,&oldColor);
      local_56 = *v != bVar1;
      MessageQueue::
      post<lumeview::SubsetInfoAnnexMessage,lume::SubsetInfoAnnex*&,unsigned_int&,bool,bool>
                (&sia_local,&local_54,&local_55,&local_56);
    }
  }
  return;
}

Assistant:

inline void SubsetInfoAnnex_ImGui (lume::SubsetInfoAnnex* sia)
{
	using namespace lume;

	const index_t numSubs = sia->num_subset_properties ();

	
	if (numSubs > 0) {
		ImGui::NewLine ();
		ImGui::SameLine (60);
		ImGui::Text ("name");
		ImGui::SameLine (160);
		ImGui::Text ("color");
		ImGui::SameLine (210);
		ImGui::Text ("visible");
		ImGui::Separator();
	}

	for(index_t isub = 0; isub < numSubs; ++isub) {
		SubsetInfoAnnex::SubsetProperties& prop = sia->subset_properties (isub);
		auto oldColor = prop.color;
		bool oldVisible = prop.visible;

		ImGui::PushID(&prop);
		ImGui::AlignTextToFramePadding();
	    ImGui::Text("%d:", isub);
	    ImGui::SameLine(60);
	    ImGui::Text(prop.name.c_str());
		ImGui::SameLine(160);
		ImGui::ColorEdit4("", prop.color.data_ptr(), ImGuiColorEditFlags_NoInputs);
		ImGui::SameLine(210);
		ImGui::Checkbox ("", &prop.visible);

		if (isub + 1 != numSubs)
			ImGui::Separator();

		ImGui::PopID();

		if (prop.color != oldColor || prop.visible != oldVisible) {
			MessageQueue::post <SubsetInfoAnnexMessage> (
					sia,
					isub,
					prop.color != oldColor,
					prop.visible != oldVisible);
		}
	}
}